

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingScanPartial<long,long,unsigned_long>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint64_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  long lVar4;
  long lVar5;
  BitpackingScanState<long,_long> *this;
  idx_t iVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  this = (BitpackingScanState<long,_long> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar6 = this->current_group_offset;
    uVar11 = 0;
    auVar15 = _DAT_01d9fb00;
    auVar16 = _DAT_01d9fb10;
    do {
      if (iVar6 == 0x800) {
        BitpackingScanState<long,_long>::LoadNextGroup(this);
        iVar6 = this->current_group_offset;
        auVar15 = _DAT_01d9fb00;
        auVar16 = _DAT_01d9fb10;
      }
      BVar1 = (this->current_group).mode;
      if (BVar1 == CONSTANT_DELTA) {
        uVar8 = 0x800 - iVar6;
        if (scan_count - uVar11 < 0x800 - iVar6) {
          uVar8 = scan_count - uVar11;
        }
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            *(idx_t *)(pdVar3 + uVar10 * 8 + uVar11 * 8 + result_offset * 8) =
                 (this->current_group_offset + uVar10) * this->current_constant +
                 this->current_frame_of_reference;
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
          goto LAB_01722fdd;
        }
LAB_01722fe4:
        iVar6 = iVar6 + uVar8;
      }
      else {
        if (BVar1 == CONSTANT) {
          lVar4 = this->current_constant;
          uVar8 = scan_count * 8 + -8 + uVar11 * -8;
          auVar14._8_4_ = (int)uVar8;
          auVar14._0_8_ = uVar8;
          auVar14._12_4_ = (int)(uVar8 >> 0x20);
          auVar12._0_8_ = uVar8 >> 3;
          auVar12._8_8_ = auVar14._8_8_ >> 3;
          lVar5 = uVar11 * 8 + 8 + result_offset * 8;
          auVar12 = auVar12 ^ auVar16;
          uVar10 = 0;
          do {
            auVar13._8_4_ = (int)uVar10;
            auVar13._0_8_ = uVar10;
            auVar13._12_4_ = (int)(uVar10 >> 0x20);
            auVar14 = (auVar13 | auVar15) ^ auVar16;
            if ((bool)(~(auVar12._4_4_ < auVar14._4_4_ ||
                        auVar12._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar12._4_4_) & 1)) {
              *(long *)(pdVar3 + uVar10 * 8 + lVar5 + -8) = lVar4;
            }
            if (auVar14._12_4_ <= auVar12._12_4_ &&
                (auVar14._8_4_ <= auVar12._8_4_ || auVar14._12_4_ != auVar12._12_4_)) {
              *(long *)(pdVar3 + uVar10 * 8 + lVar5) = lVar4;
            }
            uVar10 = uVar10 + 2;
          } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar10);
          uVar8 = scan_count - uVar11;
          if (0x800 - iVar6 <= scan_count - uVar11) {
            uVar8 = 0x800 - iVar6;
          }
LAB_01722fdd:
          iVar6 = this->current_group_offset;
          goto LAB_01722fe4;
        }
        uVar9 = (uint)iVar6 & 0x1f;
        uVar8 = 0x20 - (ulong)uVar9;
        if (scan_count - uVar11 < uVar8) {
          uVar8 = scan_count - uVar11;
        }
        bVar2 = this->current_width;
        out = (uint64_t *)(pdVar3 + uVar11 * 8 + result_offset * 8);
        if (uVar8 == 0x20) {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar6 >> 3) - (ulong)(uVar9 * bVar2 >> 3))
                     ),out,(uint)bVar2);
        }
        else {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar6 >> 3) - (ulong)(uVar9 * bVar2 >> 3))
                     ),(uint64_t *)this->decompression_buffer,(uint)bVar2);
          switchD_012bc561::default(out,this->decompression_buffer + uVar9,uVar8 * 8);
        }
        lVar4 = this->current_frame_of_reference;
        if ((this->current_group).mode == DELTA_FOR) {
          if (lVar4 != 0) {
            sVar7 = 0;
            do {
              out[sVar7] = out[sVar7] + lVar4;
              sVar7 = sVar7 + 1;
            } while (uVar8 != sVar7);
          }
          DeltaDecode<long>((long *)out,this->current_delta_offset,uVar8);
          this->current_delta_offset = out[uVar8 - 1];
        }
        else if (lVar4 != 0) {
          sVar7 = 0;
          do {
            out[sVar7] = out[sVar7] + lVar4;
            sVar7 = sVar7 + 1;
          } while (uVar8 != sVar7);
        }
        iVar6 = this->current_group_offset + uVar8;
        auVar15 = _DAT_01d9fb00;
        auVar16 = _DAT_01d9fb10;
      }
      this->current_group_offset = iVar6;
      uVar11 = uVar11 + uVar8;
    } while (uVar11 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}